

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_5x5.h
# Opt level: O0

void ncnn::conv5x5s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float *pfVar51;
  float *pfVar52;
  float *pfVar53;
  float *pfVar54;
  float *pfVar55;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  float sum2;
  float sum;
  int remain;
  int i;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  float *r5;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float *kernel0;
  float *img0;
  float *outptr2;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffe90;
  int c;
  Mat *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int local_154;
  int local_148;
  int local_144;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  float *local_f0;
  Mat local_e0;
  float *local_b0;
  float *local_a8;
  Mat *local_90;
  int local_88;
  float local_84;
  Mat local_80;
  int local_4c;
  float *local_48;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  
  local_24 = *(int *)(in_RDI + 0x1c);
  local_28 = *(int *)(in_RDI + 0x24);
  local_2c = *(int *)(in_RSI + 0x1c);
  local_30 = *(int *)(in_RSI + 0x20);
  local_34 = *(int *)(in_RSI + 0x24);
  local_20 = in_RCX;
  local_40 = Mat::operator_cast_to_float_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(local_20);
  for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
    Mat::channel(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    if (local_48 == (float *)0x0) {
      local_84 = 0.0;
    }
    else {
      local_84 = local_48[local_4c];
    }
    Mat::fill((Mat *)CONCAT44(local_84,in_stack_fffffffffffffea0),
              (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    for (local_88 = 0; c = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20), local_88 < local_28;
        local_88 = local_88 + 1) {
      in_stack_fffffffffffffe98 = (Mat *)Mat::operator_cast_to_float_(&local_80);
      local_a8 = (float *)((long)&in_stack_fffffffffffffe98->data + (long)local_2c * 4);
      local_90 = in_stack_fffffffffffffe98;
      Mat::channel(in_stack_fffffffffffffe98,c);
      in_stack_fffffffffffffe90 = Mat::operator_cast_to_float_(&local_e0);
      Mat::~Mat((Mat *)0x113e37);
      pfVar51 = local_40 + (long)(local_4c * local_28 * 0x19) + (long)(local_88 * 0x19);
      local_f8 = in_stack_fffffffffffffe90 + local_24;
      local_100 = in_stack_fffffffffffffe90 + (local_24 << 1);
      local_108 = in_stack_fffffffffffffe90 + local_24 * 3;
      local_110 = in_stack_fffffffffffffe90 + (local_24 << 2);
      local_118 = in_stack_fffffffffffffe90 + local_24 * 5;
      pfVar52 = pfVar51 + 5;
      pfVar53 = pfVar51 + 10;
      pfVar54 = pfVar51 + 0xf;
      pfVar55 = pfVar51 + 0x14;
      local_f0 = in_stack_fffffffffffffe90;
      for (local_144 = 0; local_144 + 1 < local_30; local_144 = local_144 + 2) {
        for (local_148 = local_2c; 0 < local_148; local_148 = local_148 + -1) {
          fVar1 = *local_f8;
          fVar2 = *pfVar51;
          fVar3 = local_f8[1];
          fVar4 = pfVar51[1];
          fVar5 = local_f8[2];
          fVar6 = pfVar51[2];
          fVar7 = local_f8[3];
          fVar8 = pfVar51[3];
          fVar9 = local_f8[4];
          fVar10 = pfVar51[4];
          fVar11 = *local_100;
          fVar12 = *pfVar52;
          fVar13 = local_100[1];
          fVar14 = pfVar51[6];
          fVar15 = local_100[2];
          fVar16 = pfVar51[7];
          fVar17 = local_100[3];
          fVar18 = pfVar51[8];
          fVar19 = local_100[4];
          fVar20 = pfVar51[9];
          fVar21 = *local_108;
          fVar22 = *pfVar53;
          fVar23 = local_108[1];
          fVar24 = pfVar51[0xb];
          fVar25 = local_108[2];
          fVar26 = pfVar51[0xc];
          fVar27 = local_108[3];
          fVar28 = pfVar51[0xd];
          fVar29 = local_108[4];
          fVar30 = pfVar51[0xe];
          fVar31 = *local_110;
          fVar32 = *pfVar54;
          fVar33 = local_110[1];
          fVar34 = pfVar51[0x10];
          fVar35 = local_110[2];
          fVar36 = pfVar51[0x11];
          fVar37 = local_110[3];
          fVar38 = pfVar51[0x12];
          fVar39 = local_110[4];
          fVar40 = pfVar51[0x13];
          fVar41 = *local_118;
          fVar42 = *pfVar55;
          fVar43 = local_118[1];
          fVar44 = pfVar51[0x15];
          fVar45 = local_118[2];
          fVar46 = pfVar51[0x16];
          fVar47 = local_118[3];
          fVar48 = pfVar51[0x17];
          fVar49 = local_118[4];
          fVar50 = pfVar51[0x18];
          *(float *)&local_90->data =
               local_110[4] * pfVar51[0x18] +
               local_110[3] * pfVar51[0x17] +
               local_110[2] * pfVar51[0x16] +
               local_110[1] * pfVar51[0x15] +
               *local_110 * *pfVar55 +
               local_108[4] * pfVar51[0x13] +
               local_108[3] * pfVar51[0x12] +
               local_108[2] * pfVar51[0x11] +
               local_108[1] * pfVar51[0x10] +
               *local_108 * *pfVar54 +
               local_100[4] * pfVar51[0xe] +
               local_100[3] * pfVar51[0xd] +
               local_100[2] * pfVar51[0xc] +
               local_100[1] * pfVar51[0xb] +
               *local_100 * *pfVar53 +
               local_f8[4] * pfVar51[9] +
               local_f8[3] * pfVar51[8] +
               local_f8[2] * pfVar51[7] +
               local_f8[1] * pfVar51[6] +
               *local_f8 * *pfVar52 +
               local_f0[4] * pfVar51[4] +
               local_f0[3] * pfVar51[3] +
               local_f0[2] * pfVar51[2] + local_f0[1] * pfVar51[1] + *local_f0 * *pfVar51 + 0.0 +
               *(float *)&local_90->data;
          *local_a8 = fVar49 * fVar50 +
                      fVar47 * fVar48 +
                      fVar45 * fVar46 +
                      fVar43 * fVar44 +
                      fVar41 * fVar42 +
                      fVar39 * fVar40 +
                      fVar37 * fVar38 +
                      fVar35 * fVar36 +
                      fVar33 * fVar34 +
                      fVar31 * fVar32 +
                      fVar29 * fVar30 +
                      fVar27 * fVar28 +
                      fVar25 * fVar26 +
                      fVar23 * fVar24 +
                      fVar21 * fVar22 +
                      fVar19 * fVar20 +
                      fVar17 * fVar18 +
                      fVar15 * fVar16 +
                      fVar13 * fVar14 +
                      fVar11 * fVar12 +
                      fVar9 * fVar10 +
                      fVar7 * fVar8 + fVar5 * fVar6 + fVar3 * fVar4 + fVar1 * fVar2 + 0.0 +
                      *local_a8;
          local_f0 = local_f0 + 1;
          local_f8 = local_f8 + 1;
          local_100 = local_100 + 1;
          local_108 = local_108 + 1;
          local_110 = local_110 + 1;
          local_118 = local_118 + 1;
          local_90 = (Mat *)((long)&local_90->data + 4);
          local_a8 = local_a8 + 1;
        }
        local_f0 = local_f0 + (local_24 + 4);
        local_f8 = local_f8 + (local_24 + 4);
        local_100 = local_100 + (local_24 + 4);
        local_108 = local_108 + (local_24 + 4);
        local_110 = local_110 + (local_24 + 4);
        local_118 = local_118 + (local_24 + 4);
        local_90 = (Mat *)((long)&local_90->data + (long)local_2c * 4);
        local_a8 = local_a8 + local_2c;
      }
      for (; local_144 < local_30; local_144 = local_144 + 1) {
        for (local_154 = local_2c; 0 < local_154; local_154 = local_154 + -1) {
          *(float *)&local_90->data =
               local_110[4] * pfVar51[0x18] +
               local_110[3] * pfVar51[0x17] +
               local_110[2] * pfVar51[0x16] +
               local_110[1] * pfVar51[0x15] +
               *local_110 * *pfVar55 +
               local_108[4] * pfVar51[0x13] +
               local_108[3] * pfVar51[0x12] +
               local_108[2] * pfVar51[0x11] +
               local_108[1] * pfVar51[0x10] +
               *local_108 * *pfVar54 +
               local_100[4] * pfVar51[0xe] +
               local_100[3] * pfVar51[0xd] +
               local_100[2] * pfVar51[0xc] +
               local_100[1] * pfVar51[0xb] +
               *local_100 * *pfVar53 +
               local_f8[4] * pfVar51[9] +
               local_f8[3] * pfVar51[8] +
               local_f8[2] * pfVar51[7] +
               local_f8[1] * pfVar51[6] +
               *local_f8 * *pfVar52 +
               local_f0[4] * pfVar51[4] +
               local_f0[3] * pfVar51[3] +
               local_f0[2] * pfVar51[2] + local_f0[1] * pfVar51[1] + *local_f0 * *pfVar51 + 0.0 +
               *(float *)&local_90->data;
          local_f0 = local_f0 + 1;
          local_f8 = local_f8 + 1;
          local_100 = local_100 + 1;
          local_108 = local_108 + 1;
          local_110 = local_110 + 1;
          local_90 = (Mat *)((long)&local_90->data + 4);
        }
        local_f0 = local_f0 + 4;
        local_f8 = local_f8 + 4;
        local_100 = local_100 + 4;
        local_108 = local_108 + 4;
        local_110 = local_110 + 4;
      }
      local_b0 = in_stack_fffffffffffffe90;
    }
    Mat::~Mat((Mat *)0x114c93);
  }
  return;
}

Assistant:

static void conv5x5s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*25  + q*25;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;
            const float* r4 = img0 + w*4;
            const float* r5 = img0 + w*5;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 5;
            const float* k2 = kernel0 + 10;
            const float* k3 = kernel0 + 15;
            const float* k4 = kernel0 + 20;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r0[3] * k0[3];
                    sum += r0[4] * k0[4];

                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r1[3] * k1[3];
                    sum += r1[4] * k1[4];

                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];
                    sum += r2[3] * k2[3];
                    sum += r2[4] * k2[4];

                    sum += r3[0] * k3[0];
                    sum += r3[1] * k3[1];
                    sum += r3[2] * k3[2];
                    sum += r3[3] * k3[3];
                    sum += r3[4] * k3[4];

                    sum += r4[0] * k4[0];
                    sum += r4[1] * k4[1];
                    sum += r4[2] * k4[2];
                    sum += r4[3] * k4[3];
                    sum += r4[4] * k4[4];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r1[3] * k0[3];
                    sum2 += r1[4] * k0[4];

                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r2[3] * k1[3];
                    sum2 += r2[4] * k1[4];

                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];
                    sum2 += r3[3] * k2[3];
                    sum2 += r3[4] * k2[4];

                    sum2 += r4[0] * k3[0];
                    sum2 += r4[1] * k3[1];
                    sum2 += r4[2] * k3[2];
                    sum2 += r4[3] * k3[3];
                    sum2 += r4[4] * k3[4];

                    sum2 += r5[0] * k4[0];
                    sum2 += r5[1] * k4[1];
                    sum2 += r5[2] * k4[2];
                    sum2 += r5[3] * k4[3];
                    sum2 += r5[4] * k4[4];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    r4++;
                    r5++;
                    outptr++;
                    outptr2++;
                }

                r0 += 4 + w;
                r1 += 4 + w;
                r2 += 4 + w;
                r3 += 4 + w;
                r4 += 4 + w;
                r5 += 4 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r0[3] * k0[3];
                    sum += r0[4] * k0[4];

                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r1[3] * k1[3];
                    sum += r1[4] * k1[4];

                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];
                    sum += r2[3] * k2[3];
                    sum += r2[4] * k2[4];

                    sum += r3[0] * k3[0];
                    sum += r3[1] * k3[1];
                    sum += r3[2] * k3[2];
                    sum += r3[3] * k3[3];
                    sum += r3[4] * k3[4];

                    sum += r4[0] * k4[0];
                    sum += r4[1] * k4[1];
                    sum += r4[2] * k4[2];
                    sum += r4[3] * k4[3];
                    sum += r4[4] * k4[4];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    r4++;
                    outptr++;
                }

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;

            }

        }
    }

}